

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O1

bool __thiscall
density::
conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_reentrant_consume_impl
          (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
           *this)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *pFVar1;
  void *pvVar2;
  reentrant_consume_operation cons;
  reentrant_consume_operation local_30;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_reentrant_consume(&local_30,&this->m_queue);
  if (local_30.m_consume_operation.m_control != (ControlBlock *)0x0) {
    pFVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::complete_type(&local_30.m_consume_operation);
    pvVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::unaligned_element_ptr(&local_30.m_consume_operation);
    (*pFVar1->m_align_invoke_destroy)(pvVar2);
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::commit_nodestroy(&local_30);
  }
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_30);
  return local_30.m_consume_operation.m_control != (ControlBlock *)0x0;
}

Assistant:

bool try_reentrant_consume_impl(std::true_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_reentrant_consume())
            {
                cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }